

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

ChMatrix33<double> * __thiscall
chrono::fea::ChElementBeamANCF_3333::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementBeamANCF_3333 *this,double xi,
          double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ResScalar RVar12;
  ResScalar RVar13;
  ResScalar RVar14;
  ResScalar RVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  ChVectorN<double,_6> epsilon_combined;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrixNMc<double,_3,_3> F;
  ChMatrixNM<double,_6,_6> D;
  ChMatrix33<double> J_0xi;
  MatrixNx3c Sxi_D;
  Matrix3xN e_bar;
  double local_520;
  double local_518;
  double local_510;
  ResScalar local_508;
  ResScalar local_500;
  ResScalar local_4f8;
  double local_4e8;
  ResScalar local_4e0;
  ChMatrix33<double> *local_4d8;
  Matrix<double,_3,_3,_0,_3,_3> local_4d0;
  undefined1 local_488 [48];
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_458;
  Matrix<double,_3,_3,_0,_3,_3> local_428;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_3e0;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_3b0;
  ChMatrixNM<double,_6,_6> local_380;
  Matrix<double,_3,_3,_1,_3,_3> local_250;
  Matrix<double,_9,_3,_0,_9,_3> local_208;
  Matrix<double,_3,_3,_1,_3,_3> *local_130 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_4d8 = __return_storage_ptr__;
  Calc_Sxi_D(this,&local_208,xi,eta,zeta);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       (double)&this->m_ebar0;
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       (double)&local_208;
  local_130[0] = &local_250;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_130,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
              *)&local_380);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       (double)&local_208;
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       (double)&local_250;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Product<Eigen::Matrix<double,9,3,0,9,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            (&local_208,
             (Product<Eigen::Matrix<double,_9,_3,_0,_9,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
              *)&local_380);
  CalcCoordMatrix(this,(Matrix3xN *)local_130);
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[0] =
       (double)local_130;
  local_380.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.array[1] =
       (double)&local_208;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_428,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
              *)&local_380);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_380,&local_428,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_4d0,&local_428,0);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_4d0);
  dVar7 = (RVar12 + -1.0) * 0.5;
  local_520 = dVar7;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_380,&local_428,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_4d0,&local_428,1);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_4d0);
  dVar8 = (RVar12 + -1.0) * 0.5;
  local_518 = dVar8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_380,&local_428,2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_4d0,&local_428,2);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_4d0);
  dVar9 = (RVar12 + -1.0) * 0.5;
  local_510 = dVar9;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_380,&local_428,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_4d0,&local_428,2);
  RVar12 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_4d0);
  local_508 = RVar12;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_380,&local_428,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_4d0,&local_428,2);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_380,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_4d0);
  local_500 = RVar13;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_380,&local_428,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_4d0,&local_428,1);
  local_4f8 = Eigen::internal::
              dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
              ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    &local_380,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    &local_4d0);
  if (this->m_damping_enabled == true) {
    local_4e0 = local_4f8;
    CalcCoordDerivMatrix(this,(Matrix3xN *)&local_380);
    local_488._8_8_ = &local_208;
    local_488._0_8_ =
         (BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)&local_380;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,3,0,9,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_4d0,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_3,_0,_9,_3>,_0>_>
                *)local_488);
    local_4e8 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_488,&local_428,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_458,&local_4d0,0);
    auVar19._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_488,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_458);
    auVar19._8_56_ = extraout_var;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_4e8;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar7;
    auVar1 = vfmadd213sd_fma(auVar19._0_16_,auVar22,auVar1);
    local_520 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_488,&local_428,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_458,&local_4d0,1);
    auVar20._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_488,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_458);
    auVar20._8_56_ = extraout_var_00;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar8;
    auVar1 = vfmadd213sd_fma(auVar20._0_16_,auVar23,auVar2);
    local_518 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_488,&local_428,2);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_458,&local_4d0,2);
    auVar21._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_488,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_458);
    auVar21._8_56_ = extraout_var_01;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar9;
    auVar1 = vfmadd213sd_fma(auVar21._0_16_,auVar24,auVar3);
    local_510 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_488,&local_428,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_458,&local_4d0,2);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_488,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_458);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_3b0,&local_4d0,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_3e0,&local_428,2);
    RVar15 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_3b0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_3e0);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar7;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = RVar12;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = RVar15 + RVar14;
    auVar1 = vfmadd213sd_fma(auVar16,auVar25,auVar4);
    local_508 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_488,&local_428,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_458,&local_4d0,2);
    RVar12 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_488,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_458);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_3b0,&local_4d0,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_3e0,&local_428,2);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_3b0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_3e0);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar7;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = RVar13;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = RVar14 + RVar12;
    auVar1 = vfmadd213sd_fma(auVar17,auVar26,auVar5);
    local_500 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_488,&local_428,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_458,&local_4d0,1);
    RVar12 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_488,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_458);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_3b0,&local_4d0,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_3e0,&local_428,1);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_3b0,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_3e0);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar7;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_4e0;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = RVar13 + RVar12;
    auVar1 = vfmadd213sd_fma(auVar18,auVar27,auVar6);
    local_4f8 = auVar1._0_8_;
  }
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)&local_4d0
             ,&(this->m_material).
               super___shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>);
  ChMaterialBeamANCF::Get_D
            ((ChMaterialBeamANCF *)
             local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0],&local_380);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + 1));
  local_488._8_8_ = &local_520;
  local_488._0_8_ = &local_380;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)&local_4d0,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)local_488);
  auVar11._8_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  auVar11._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar28._8_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar28._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar28._16_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  auVar28._24_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [2];
  (local_4d8->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  (local_4d8->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [1];
  auVar10._8_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [4];
  auVar10._0_8_ =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [3];
  auVar1 = vunpcklpd_avx(auVar10,auVar11);
  auVar28 = vblendpd_avx(ZEXT1632(auVar1),auVar28,8);
  auVar28 = vpermpd_avx2(auVar28,0xc4);
  *(undefined1 (*) [32])
   ((local_4d8->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       auVar28;
  auVar1 = vshufpd_avx(auVar11,auVar11,1);
  *(undefined1 (*) [16])
   ((local_4d8->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar1;
  (local_4d8->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_4d0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [5];
  return local_4d8;
}

Assistant:

ChMatrix33<> ChElementBeamANCF_3333::GetPK2Stress(const double xi,
                                                  const double eta,
                                                  const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    ChMatrixNM<double, 6, 6> D;
    GetMaterial()->Get_D(D);

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}